

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

TemplateTokenVector * __thiscall
minja::Parser::tokenize(TemplateTokenVector *__return_storage_ptr__,Parser *this)

{
  char *pcVar1;
  Parser *this_00;
  element_type *peVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  SpaceHandling SVar8;
  Expression *__tmp;
  CommentTemplateToken *this_01;
  long lVar9;
  TextTemplateToken *pTVar10;
  ForTemplateToken *this_02;
  MacroTemplateToken *this_03;
  FilterTemplateToken *this_04;
  runtime_error *prVar11;
  pointer *__ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *pcVar14;
  shared_ptr<minja::Expression> filter;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  SpaceHandling pre_space;
  vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
  *local_1d0;
  Parser *local_1c8;
  Location location;
  shared_ptr<minja::Expression> expr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  value_type content;
  shared_ptr<minja::Expression> iterable;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_class_16_2_ee9a8eb6 parseBlockClose;
  shared_ptr<minja::Expression> value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  SpaceHandling post_space;
  string text;
  smatch match;
  
  local_1d0 = (vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
               *)__return_storage_ptr__;
  local_1c8 = this;
  if ((tokenize()::comment_tok_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&tokenize()::comment_tok_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::comment_tok_abi_cxx11_,"\\{#([-~]?)([\\s\\S]*?)([-~]?)#\\}",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::comment_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::comment_tok_abi_cxx11_);
    this = local_1c8;
  }
  if ((tokenize()::expr_open_regex_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&tokenize()::expr_open_regex_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::expr_open_regex_abi_cxx11_,"\\{\\{([-~])?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::expr_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::expr_open_regex_abi_cxx11_);
    this = local_1c8;
  }
  if ((tokenize()::block_open_regex_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&tokenize()::block_open_regex_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::block_open_regex_abi_cxx11_,"^\\{%([-~])?\\s*",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_open_regex_abi_cxx11_);
    this = local_1c8;
  }
  if ((tokenize()::block_keyword_tok_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&tokenize()::block_keyword_tok_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::block_keyword_tok_abi_cxx11_,
               "(if|else|elif|endif|for|endfor|generation|endgeneration|set|endset|block|endblock|macro|endmacro|filter|endfilter|break|continue)\\b"
               ,0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_keyword_tok_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_keyword_tok_abi_cxx11_);
    this = local_1c8;
  }
  if ((tokenize()::non_text_open_regex_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&tokenize()::non_text_open_regex_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::non_text_open_regex_abi_cxx11_,"\\{\\{|\\{%|\\{#",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::non_text_open_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::non_text_open_regex_abi_cxx11_);
    this = local_1c8;
  }
  if ((tokenize()::expr_close_regex_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&tokenize()::expr_close_regex_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::expr_close_regex_abi_cxx11_,"\\s*([-~])?\\}\\}",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::expr_close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::expr_close_regex_abi_cxx11_);
    this = local_1c8;
  }
  if ((tokenize()::block_close_regex_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&tokenize()::block_close_regex_abi_cxx11_), iVar6 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&tokenize()::block_close_regex_abi_cxx11_,"\\s*([-~])?%\\}",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &tokenize()::block_close_regex_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&tokenize()::block_close_regex_abi_cxx11_);
    this = local_1c8;
  }
  *(undefined8 *)local_1d0 = 0;
  *(pointer *)(local_1d0 + 8) = (pointer)0x0;
  *(pointer *)(local_1d0 + 0x10) = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match._M_begin._M_current = (char *)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->it)._M_current != (this->end)._M_current) {
    do {
      paVar13 = &content.field_2;
      location.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (this->template_str).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      location.source.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (this->template_str).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (location.source.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (location.source.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (location.source.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      location.pos = (long)(this->it)._M_current - (long)(this->start)._M_current;
      consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&filter,this,&tokenize()::comment_tok_abi_cxx11_,Keep);
      content.field_2._M_allocated_capacity =
           (size_type)
           local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      content._M_string_length =
           (size_type)
           local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      content._M_dataplus._M_p =
           (pointer)local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1e8._M_allocated_capacity;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e8._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&content);
      pbVar4 = local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&filter);
      if (pbVar3 != pbVar4) {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((long)local_188.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x20));
        content._M_dataplus._M_p = (pointer)paVar13;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&content,
                   ((element_type *)
                   ((long)local_188.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 0x40))->_vptr_Expression,
                   (long)&(((((Location *)
                             ((long)local_188.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 0x48))->source).
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_M_dataplus)._M_p +
                   (long)((element_type *)
                         ((long)local_188.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x40))->_vptr_Expression
                  );
        iVar7 = std::__cxx11::string::compare
                          ((char *)((long)local_188.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x60));
        this = local_1c8;
        this_01 = (CommentTemplateToken *)operator_new(0x50);
        CommentTemplateToken::CommentTemplateToken
                  (this_01,&location,(uint)(iVar6 == 0),(uint)(iVar7 == 0),&content);
        filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this_01;
        std::
        vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
        ::
        emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                  (local_1d0,
                   (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   &filter);
        goto joined_r0x001e7179;
      }
      consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&filter,local_1c8,&tokenize()::expr_open_regex_abi_cxx11_,Keep);
      content.field_2._M_allocated_capacity =
           (size_type)
           local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      content._M_string_length =
           (size_type)
           local_188.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      content._M_dataplus._M_p =
           (pointer)local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1e8._M_allocated_capacity;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e8._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&content);
      pbVar4 = local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&filter);
      if (pbVar3 == pbVar4) {
        consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&filter,local_1c8,&tokenize()::block_open_regex_abi_cxx11_,Keep);
        content.field_2._M_allocated_capacity =
             (size_type)
             local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        content._M_string_length =
             (size_type)
             local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        content._M_dataplus._M_p =
             (pointer)local_188.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_1e8._M_allocated_capacity;
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&content);
        pbVar4 = local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filter);
        this = local_1c8;
        if (pbVar3 == pbVar4) {
          bVar5 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(local_1c8->it)._M_current,
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(local_1c8->end)._M_current,&match,
                             &tokenize()::non_text_open_regex_abi_cxx11_,0);
          if (bVar5) {
            lVar9 = (long)match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            if (lVar9 == 0) {
              pcVar14 = match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-3].
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .first._M_current;
LAB_001e7942:
              if (pcVar14 == match._M_begin._M_current) {
                this_05 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)match.
                                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x48);
LAB_001e8c74:
                iVar6 = std::__cxx11::
                        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::compare(this_05,"{#");
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                if (iVar6 == 0) {
                  std::runtime_error::runtime_error(prVar11,"Missing end of comment tag");
                }
                else {
                  std::runtime_error::runtime_error(prVar11,"Internal error: Expected a comment");
                }
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
            }
            else {
              pcVar14 = ((match.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).first._M_current;
              if (lVar9 == 0x48) goto LAB_001e7942;
              this_05 = match.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (pcVar14 == match._M_begin._M_current) goto LAB_001e8c74;
            }
            pcVar1 = (this->it)._M_current;
            pcVar14 = pcVar1 + ((long)pcVar14 - (long)match._M_begin._M_current);
            content._M_dataplus._M_p = (pointer)paVar13;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&content,pcVar1,pcVar14);
            std::__cxx11::string::operator=((string *)&text,(string *)&content);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)content._M_dataplus._M_p != paVar13) {
              operator_delete(content._M_dataplus._M_p,content.field_2._M_allocated_capacity + 1);
            }
            (this->it)._M_current = pcVar14;
            pTVar10 = (TextTemplateToken *)operator_new(0x50);
            TextTemplateToken::TextTemplateToken(pTVar10,&location,Keep,Keep,&text);
            content._M_dataplus._M_p = (pointer)pTVar10;
            std::
            vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
            ::
            emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                      (local_1d0,
                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)&content);
          }
          else {
            content._M_dataplus._M_p = (pointer)paVar13;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&content,(this->it)._M_current,(this->end)._M_current);
            std::__cxx11::string::operator=((string *)&text,(string *)&content);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)content._M_dataplus._M_p != paVar13) {
              operator_delete(content._M_dataplus._M_p,content.field_2._M_allocated_capacity + 1);
            }
            (this->it)._M_current = (this->end)._M_current;
            pTVar10 = (TextTemplateToken *)operator_new(0x50);
            TextTemplateToken::TextTemplateToken(pTVar10,&location,Keep,Keep,&text);
            content._M_dataplus._M_p = (pointer)pTVar10;
            std::
            vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
            ::
            emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                      (local_1d0,
                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)&content);
          }
          if (content._M_dataplus._M_p != (pointer)0x0) {
            (**(code **)(*(long *)content._M_dataplus._M_p + 8))();
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((long)local_188.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 0x20));
          pre_space = (SpaceHandling)(iVar6 == 0);
          content._M_string_length = 0;
          content.field_2._M_allocated_capacity =
               content.field_2._M_allocated_capacity & 0xffffffffffffff00;
          parseBlockClose.group = &local_188;
          parseBlockClose.this = local_1c8;
          content._M_dataplus._M_p = (pointer)paVar13;
          consumeToken((string *)&filter,local_1c8,&tokenize()::block_keyword_tok_abi_cxx11_,Strip);
          lVar9 = std::__cxx11::string::operator=((string *)&content,(string *)&filter);
          lVar9 = *(long *)(lVar9 + 8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_1e8) {
            operator_delete(filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(ulong)(local_1e8._M_allocated_capacity + 1));
          }
          this = local_1c8;
          if (lVar9 == 0) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"Expected block keyword");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar6 = std::__cxx11::string::compare((char *)&content);
          bVar5 = SUB81(this,0);
          if (iVar6 == 0) {
            parseExpression((Parser *)&filter,bVar5);
            if (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar11,"Expected condition in if block");
              __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
            expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)operator_new(0x40);
            _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
            (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
            *(undefined4 *)
             &((expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              location).source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = 2;
            ((expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            location).source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 location.source.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            ((expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            location).pos =
                 (size_t)location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            if (location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (location.source.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (location.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (location.source.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (location.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            _vptr_Expression = (_func_int **)location.pos;
            *(SpaceHandling *)
             &expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              location.source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = pre_space;
            *(SpaceHandling *)
             ((long)&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     [1].location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 4) = SVar8;
            (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Expression = (_func_int **)&PTR__IfTemplateToken_00271088;
            filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            location.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            location.pos = (size_t)_Var12._M_pi;
            filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::
            vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
            ::
            emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                      (local_1d0,
                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)&expr);
            _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
            if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression[1])();
              _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            }
joined_r0x001e7ab1:
            filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = _Var12._M_pi;
            if (_Var12._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001e7d36:
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var12._M_pi);
            }
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&content);
            if (iVar6 == 0) {
              parseExpression((Parser *)&filter,bVar5);
              if (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar11,"Expected condition in elif block");
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)operator_new(0x40);
              _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
              (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
              *(undefined4 *)
               &((expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = 4;
              ((expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              location).source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   location.source.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              ((expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              location).pos =
                   (size_t)location.source.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
              if (location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (location.source.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (location.source.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (location.source.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (location.source.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              _vptr_Expression = (_func_int **)location.pos;
              *(SpaceHandling *)
               &expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = pre_space;
              *(SpaceHandling *)
               ((long)&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       [1].location.source.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + 4) = SVar8;
              (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_Expression = (_func_int **)&PTR__ElifTemplateToken_002710c0;
              filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              location.source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              location.pos = (size_t)_Var12._M_pi;
              filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        (local_1d0,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&expr);
              _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
              if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_Expression[1])();
                _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
              }
              goto joined_r0x001e7ab1;
            }
            iVar6 = std::__cxx11::string::compare((char *)&content);
            if (iVar6 != 0) {
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 == 0) {
                SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x30);
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                *(undefined4 *)
                 &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->location).source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = 5;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).pos =
                     (size_t)location.source.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                if (location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                _vptr_Expression = (_func_int **)location.pos;
                *(SpaceHandling *)
                 &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                  .location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = pre_space;
                *(SpaceHandling *)
                 ((long)&filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr[1].location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4) = SVar8;
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00271130;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          (local_1d0,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&filter);
                goto joined_r0x001e7179;
              }
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 == 0) {
                if ((tokenize()::recursive_tok_abi_cxx11_ == '\0') &&
                   (iVar6 = __cxa_guard_acquire(&tokenize()::recursive_tok_abi_cxx11_), iVar6 != 0))
                {
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                            (&tokenize()::recursive_tok_abi_cxx11_,"recursive\\b",0x10);
                  __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                               ~basic_regex,&tokenize()::recursive_tok_abi_cxx11_,&__dso_handle);
                  __cxa_guard_release(&tokenize()::recursive_tok_abi_cxx11_);
                  this = local_1c8;
                }
                if ((tokenize()::if_tok_abi_cxx11_ == '\0') &&
                   (iVar6 = __cxa_guard_acquire(&tokenize()::if_tok_abi_cxx11_), iVar6 != 0)) {
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                            (&tokenize()::if_tok_abi_cxx11_,"if\\b",0x10);
                  __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                               ~basic_regex,&tokenize()::if_tok_abi_cxx11_,&__dso_handle);
                  __cxa_guard_release(&tokenize()::if_tok_abi_cxx11_);
                  this = local_1c8;
                }
                parseVarNames_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&expr,this);
                if ((tokenize()::in_tok_abi_cxx11_ == '\0') &&
                   (iVar6 = __cxa_guard_acquire(&tokenize()::in_tok_abi_cxx11_), iVar6 != 0)) {
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                            (&tokenize()::in_tok_abi_cxx11_,"in\\b",0x10);
                  __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                               ~basic_regex,&tokenize()::in_tok_abi_cxx11_,&__dso_handle);
                  __cxa_guard_release(&tokenize()::in_tok_abi_cxx11_);
                  this = local_1c8;
                }
                consumeToken((string *)&filter,this,&tokenize()::in_tok_abi_cxx11_,Strip);
                _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr != &local_1e8) {
                  operator_delete(filter.
                                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(ulong)(local_1e8._M_allocated_capacity + 1));
                }
                if (_Var12._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar11,"Expected \'in\' keyword in for block");
                  __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                parseExpression((Parser *)&iterable,SUB81(this,0));
                if (iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr == (element_type *)0x0) {
                  prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar11,"Expected iterable in for block");
                  __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                consumeToken((string *)&filter,this,&tokenize()::if_tok_abi_cxx11_,Strip);
                _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr != &local_1e8) {
                  operator_delete(filter.
                                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(ulong)(local_1e8._M_allocated_capacity + 1));
                }
                if (_Var12._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  parseExpression((Parser *)&filter,SUB81(this,0));
                  pbVar3 = local_f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)filter.
                                super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount;
                  local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)filter.
                                super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr;
                  filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  if ((pbVar3 != (pointer)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar3),
                     filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (filter.
                               super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                }
                consumeToken((string *)&filter,this,&tokenize()::recursive_tok_abi_cxx11_,Strip);
                _Var12 = filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr != &local_1e8) {
                  operator_delete(filter.
                                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(ulong)(local_1e8._M_allocated_capacity + 1));
                }
                SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                this_02 = (ForTemplateToken *)operator_new(0x70);
                ForTemplateToken::ForTemplateToken
                          (this_02,&location,pre_space,SVar8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&expr,&iterable,(shared_ptr<minja::Expression> *)&local_f8,
                           _Var12._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0);
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)this_02;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          (local_1d0,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&filter);
                if (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    != (element_type *)0x0) {
                  (*(filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->_vptr_Expression[1])();
                }
                if (local_f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_f8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                if (iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (iterable.
                             super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&expr);
                goto LAB_001e7181;
              }
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 == 0) {
                SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x30);
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                *(undefined4 *)
                 &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->location).source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = 7;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).pos =
                     (size_t)location.source.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                if (location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                _vptr_Expression = (_func_int **)location.pos;
                *(SpaceHandling *)
                 &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                  .location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = pre_space;
                *(SpaceHandling *)
                 ((long)&filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr[1].location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4) = SVar8;
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_002711a0;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          (local_1d0,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&filter);
                goto joined_r0x001e7179;
              }
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 == 0) {
                SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x30);
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                *(undefined4 *)
                 &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->location).source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = 8;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).pos =
                     (size_t)location.source.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                if (location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                _vptr_Expression = (_func_int **)location.pos;
                *(SpaceHandling *)
                 &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                  .location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = pre_space;
                *(SpaceHandling *)
                 ((long)&filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr[1].location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4) = SVar8;
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_002711d8;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          (local_1d0,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&filter);
                goto joined_r0x001e7179;
              }
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 == 0) {
                SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x30);
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                *(undefined4 *)
                 &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->location).source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = 9;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).pos =
                     (size_t)location.source.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                if (location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                _vptr_Expression = (_func_int **)location.pos;
                *(SpaceHandling *)
                 &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                  .location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = pre_space;
                *(SpaceHandling *)
                 ((long)&filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr[1].location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4) = SVar8;
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00271210;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          (local_1d0,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&filter);
                goto joined_r0x001e7179;
              }
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 == 0) {
                if ((tokenize()::namespaced_var_regex_abi_cxx11_ == '\0') &&
                   (iVar6 = __cxa_guard_acquire(&tokenize()::namespaced_var_regex_abi_cxx11_),
                   iVar6 != 0)) {
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                            (&tokenize()::namespaced_var_regex_abi_cxx11_,"(\\w+)\\s*\\.\\s*(\\w+)",
                             0x10);
                  __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                               ~basic_regex,&tokenize()::namespaced_var_regex_abi_cxx11_,
                               &__dso_handle);
                  __cxa_guard_release(&tokenize()::namespaced_var_regex_abi_cxx11_);
                  this = local_1c8;
                }
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)&local_1e8;
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_1e8._M_allocated_capacity =
                     local_1e8._M_allocated_capacity & 0xffffffffffffff00;
                local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&iterable,this,&tokenize()::namespaced_var_regex_abi_cxx11_,
                                   Strip);
                local_198._M_allocated_capacity =
                     (size_type)
                     local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
                expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        local_188.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
                expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_188.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)local_128._M_allocated_capacity;
                local_188.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)iterable.
                              super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr;
                local_188.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)iterable.
                              super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_128._M_allocated_capacity = 0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&expr);
                pbVar4 = local_188.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pbVar3 = local_188.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&iterable);
                if (pbVar3 == pbVar4) {
                  parseVarNames_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&iterable,this);
                  local_198._M_allocated_capacity =
                       (size_type)
                       local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)
                       local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)local_128._M_allocated_capacity;
                  local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)iterable.
                                super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr;
                  local_f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)iterable.
                                super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                  iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)0x0;
                  iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_128._M_allocated_capacity = 0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&expr);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&iterable);
                  iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)&local_128;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&iterable,"=","");
                  consumeToken((string *)&expr,this,(string *)&iterable,Strip);
                  _Var12 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr != &local_198) {
                    operator_delete(expr.
                                    super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(ulong)(local_198._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr != &local_128) {
                    operator_delete(iterable.
                                    super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(ulong)(local_128._M_allocated_capacity + 1));
                  }
                  if (_Var12._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    parseExpression((Parser *)&expr,SUB81(this,0));
                    peVar2 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount = expr.
                                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount;
                    expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)0x0;
                    if (peVar2 == (element_type *)0x0) {
                      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error(prVar11,"Expected value in set block");
                      goto LAB_001e8dc6;
                    }
                  }
                }
                else {
                  std::__cxx11::string::_M_assign((string *)&filter);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_f8,
                              (value_type *)
                              ((long)local_188.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x40));
                  iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)&local_128;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&iterable,"=","");
                  consumeToken((string *)&expr,this,(string *)&iterable,Strip);
                  _Var12 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr != &local_198) {
                    operator_delete(expr.
                                    super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(ulong)(local_198._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr != &local_128) {
                    operator_delete(iterable.
                                    super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,(ulong)(local_128._M_allocated_capacity + 1));
                  }
                  if (_Var12._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar11,"Expected equals sign in set block");
LAB_001e8dc6:
                    __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  parseExpression((Parser *)&expr,SUB81(this,0));
                  peVar2 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount = expr.
                                super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount;
                  expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  if (peVar2 == (element_type *)0x0) {
                    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar11,"Expected value in set block");
                    goto LAB_001e8dc6;
                  }
                }
                post_space = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                std::
                make_unique<minja::SetTemplateToken,minja::Location&,minja::SpaceHandling&,minja::SpaceHandling&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::shared_ptr<minja::Expression>>
                          ((Location *)&iterable,(SpaceHandling *)&location,&pre_space,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &post_space,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&filter,(shared_ptr<minja::Expression> *)&local_f8);
                expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          (local_1d0,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&expr);
                if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->_vptr_Expression[1])();
                }
                expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                if (iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  (*(iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_vptr_Expression[1])();
                }
                if (value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_f8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr != &local_1e8) {
                  operator_delete(filter.
                                  super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(ulong)(local_1e8._M_allocated_capacity + 1));
                }
                goto LAB_001e7181;
              }
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 == 0) {
                SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)operator_new(0x30);
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                *(undefined4 *)
                 &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->location).source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = 0xb;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                location).pos =
                     (size_t)location.source.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                if (location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi)->_M_use_count =
                         (location.source.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                _vptr_Expression = (_func_int **)location.pos;
                *(SpaceHandling *)
                 &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                  .location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = pre_space;
                *(SpaceHandling *)
                 ((long)&filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr[1].location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr + 4) = SVar8;
                (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression = (_func_int **)&PTR__TemplateToken_00271280;
                std::
                vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                ::
                emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                          (local_1d0,
                           (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)&filter);
                goto joined_r0x001e7179;
              }
              iVar6 = std::__cxx11::string::compare((char *)&content);
              if (iVar6 != 0) {
                iVar6 = std::__cxx11::string::compare((char *)&content);
                if (iVar6 == 0) {
                  SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                  filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)operator_new(0x30);
                  (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->_vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                  *(undefined4 *)
                   &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->location).source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = 0xe;
                  ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->location).source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       location.source.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
                  ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->location).pos =
                       (size_t)location.source.
                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                  if (location.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (location.source.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (location.source.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (location.source.
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (location.source.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1]
                  ._vptr_Expression = (_func_int **)location.pos;
                  *(SpaceHandling *)
                   &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1].location.source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = pre_space;
                  *(SpaceHandling *)
                   ((long)&filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr[1].location.source.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 4) = SVar8;
                  (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->_vptr_Expression = (_func_int **)&PTR__TemplateToken_00271368;
                  std::
                  vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                  ::
                  emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                            (local_1d0,
                             (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)&filter);
                }
                else {
                  iVar6 = std::__cxx11::string::compare((char *)&content);
                  if (iVar6 == 0) {
                    parseExpression((Parser *)&filter,bVar5);
                    if (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr == (element_type *)0x0) {
                      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error
                                (prVar11,"Expected expression in filter block");
                      __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                    this_04 = (FilterTemplateToken *)operator_new(0x40);
                    FilterTemplateToken::FilterTemplateToken
                              (this_04,&location,pre_space,SVar8,&filter);
                    expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)this_04;
                    std::
                    vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                    ::
                    emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                              (local_1d0,
                               (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)&expr);
                    _Var12 = filter.
                             super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
                    if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr != (element_type *)0x0) {
                      (*(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->_vptr_Expression[1])();
                      _Var12 = filter.
                               super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount;
                    }
                    goto joined_r0x001e822e;
                  }
                  iVar6 = std::__cxx11::string::compare((char *)&content);
                  if (iVar6 == 0) {
                    SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                    filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         = (element_type *)operator_new(0x30);
                    (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->_vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                    *(undefined4 *)
                     &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->location).source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = 0x10;
                    ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->location).source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                    ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->location).pos =
                         (size_t)location.source.
                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                    if (location.source.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (location.source.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (location.source.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1]._vptr_Expression = (_func_int **)location.pos;
                    *(SpaceHandling *)
                     &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr[1].location.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = pre_space;
                    *(SpaceHandling *)
                     ((long)&filter.
                             super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr[1].location.source.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 4) = SVar8;
                    (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->_vptr_Expression = (_func_int **)&PTR__TemplateToken_002713d8;
                    std::
                    vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                    ::
                    emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                              (local_1d0,
                               (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)&filter);
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)&content);
                    if ((iVar6 != 0) &&
                       (iVar6 = std::__cxx11::string::compare((char *)&content), iVar6 != 0)) {
                      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&filter,"Unexpected block: ",&content);
                      std::runtime_error::runtime_error(prVar11,(string *)&filter);
                      __cxa_throw(prVar11,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
                    iVar6 = std::__cxx11::string::compare((char *)&content);
                    filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         = (element_type *)operator_new(0x38);
                    (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->_vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
                    *(undefined4 *)
                     &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->location).source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = 0x11;
                    ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->location).source.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                    ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->location).pos =
                         (size_t)location.source.
                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                    if (location.source.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (location.source.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (location.source.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1]._vptr_Expression = (_func_int **)location.pos;
                    *(SpaceHandling *)
                     &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr[1].location.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = pre_space;
                    *(SpaceHandling *)
                     ((long)&filter.
                             super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr[1].location.source.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + 4) = SVar8;
                    (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->_vptr_Expression = (_func_int **)&PTR__TemplateToken_00271410;
                    *(uint *)&filter.
                              super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr[1].location.source.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi = (uint)(iVar6 != 0);
                    std::
                    vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
                    ::
                    emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                              (local_1d0,
                               (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)&filter);
                  }
                }
                goto joined_r0x001e7179;
              }
              parseIdentifier((Parser *)&expr);
              if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar11,"Expected macro name in macro block");
                __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              parseParameters_abi_cxx11_((Parameters *)&filter,this);
              SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
              this_03 = (MacroTemplateToken *)operator_new(0x58);
              MacroTemplateToken::MacroTemplateToken
                        (this_03,&location,pre_space,SVar8,(shared_ptr<minja::VariableExpr> *)&expr,
                         (Parameters *)&filter);
              iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)this_03;
              std::
              vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
              ::
              emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                        (local_1d0,
                         (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)&iterable);
              if (iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  != (element_type *)0x0) {
                (*(iterable.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->_vptr_Expression[1])();
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                         *)&filter);
              _Var12 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
joined_r0x001e822e:
              if (_Var12._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
              goto LAB_001e7181;
              goto LAB_001e7d36;
            }
            SVar8 = tokenize::anon_class_16_2_ee9a8eb6::operator()(&parseBlockClose);
            filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)operator_new(0x30);
            (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Expression = (_func_int **)&PTR__TemplateToken_00270930;
            *(undefined4 *)
             &((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              location).source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = 3;
            ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            location).source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 location.source.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
            ((filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            location).pos =
                 (size_t)location.source.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            if (location.source.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (location.source.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (location.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (location.source.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (location.source.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            _vptr_Expression = (_func_int **)location.pos;
            *(SpaceHandling *)
             &filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
              location.source.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = pre_space;
            *(SpaceHandling *)
             ((long)&filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     [1].location.source.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + 4) = SVar8;
            (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Expression = (_func_int **)&PTR__TemplateToken_002710f8;
            std::
            vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
            ::
            emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                      (local_1d0,
                       (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)&filter);
joined_r0x001e7179:
            if (filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              (*(filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_Expression[1])();
            }
          }
LAB_001e7181:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)content._M_dataplus._M_p != &content.field_2) {
            operator_delete(content._M_dataplus._M_p,content.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((long)local_188.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x20));
        this_00 = local_1c8;
        parseExpression((Parser *)&expr,SUB81(local_1c8,0));
        consumeTokenGroups((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&filter,this_00,&tokenize()::expr_close_regex_abi_cxx11_,Strip);
        content.field_2._M_allocated_capacity =
             (size_type)
             local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        content._M_string_length =
             (size_type)
             local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        content._M_dataplus._M_p =
             (pointer)local_188.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_1e8._M_allocated_capacity;
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        filter.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8._M_allocated_capacity = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&content);
        pbVar4 = local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&filter);
        if (pbVar3 == pbVar4) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"Expected closing expression tag");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar7 = std::__cxx11::string::compare
                          ((char *)((long)local_188.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 0x20));
        this = local_1c8;
        content._M_dataplus._M_p = (pointer)operator_new(0x40);
        _Var12 = expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        *(undefined ***)content._M_dataplus._M_p = &PTR__TemplateToken_00270930;
        content._M_dataplus._M_p[8] = '\x01';
        content._M_dataplus._M_p[9] = '\0';
        content._M_dataplus._M_p[10] = '\0';
        content._M_dataplus._M_p[0xb] = '\0';
        *(element_type **)(content._M_dataplus._M_p + 0x10) =
             location.source.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(content._M_dataplus._M_p + 0x18) =
             location.source.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (location.source.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (location.source.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (location.source.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count =
                 (location.source.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        *(size_t *)(content._M_dataplus._M_p + 0x20) = location.pos;
        *(uint *)(content._M_dataplus._M_p + 0x28) = (uint)(iVar6 == 0);
        *(uint *)(content._M_dataplus._M_p + 0x2c) = (uint)(iVar7 == 0);
        *(undefined ***)content._M_dataplus._M_p = &PTR__ExpressionTemplateToken_00271050;
        expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)(content._M_dataplus._M_p + 0x30) =
             expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(content._M_dataplus._M_p + 0x38) =
             _Var12._M_pi;
        expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::
        vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>
        ::
        emplace_back<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>
                  (local_1d0,
                   (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   &content);
        if (content._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)content._M_dataplus._M_p + 8))();
        }
        if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (location.source.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (location.source.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    } while ((this->it)._M_current != (this->end)._M_current);
    if (match.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(match.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)match.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)text._M_dataplus._M_p != &text.field_2) {
    operator_delete(text._M_dataplus._M_p,
                    CONCAT71(text.field_2._M_allocated_capacity._1_7_,text.field_2._M_local_buf[0])
                    + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  return (TemplateTokenVector *)local_1d0;
}

Assistant:

TemplateTokenVector tokenize() {
      static std::regex comment_tok(R"(\{#([-~]?)([\s\S]*?)([-~]?)#\})");
      static std::regex expr_open_regex(R"(\{\{([-~])?)");
      static std::regex block_open_regex(R"(^\{%([-~])?\s*)");
      static std::regex block_keyword_tok(R"((if|else|elif|endif|for|endfor|generation|endgeneration|set|endset|block|endblock|macro|endmacro|filter|endfilter|break|continue)\b)");
      static std::regex non_text_open_regex(R"(\{\{|\{%|\{#)");
      static std::regex expr_close_regex(R"(\s*([-~])?\}\})");
      static std::regex block_close_regex(R"(\s*([-~])?%\})");

      TemplateTokenVector tokens;
      std::vector<std::string> group;
      std::string text;
      std::smatch match;

      try {
        while (it != end) {
          auto location = get_location();

          if (!(group = consumeTokenGroups(comment_tok, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);
            auto content = group[2];
            auto post_space = parsePostSpace(group[3]);
            tokens.push_back(std::make_unique<CommentTemplateToken>(location, pre_space, post_space, content));
          } else if (!(group = consumeTokenGroups(expr_open_regex, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);
            auto expr = parseExpression();

            if ((group = consumeTokenGroups(expr_close_regex)).empty()) {
              throw std::runtime_error("Expected closing expression tag");
            }

            auto post_space = parsePostSpace(group[1]);
            tokens.push_back(std::make_unique<ExpressionTemplateToken>(location, pre_space, post_space, std::move(expr)));
          } else if (!(group = consumeTokenGroups(block_open_regex, SpaceHandling::Keep)).empty()) {
            auto pre_space = parsePreSpace(group[1]);

            std::string keyword;

            auto parseBlockClose = [&]() -> SpaceHandling {
              if ((group = consumeTokenGroups(block_close_regex)).empty()) throw std::runtime_error("Expected closing block tag");
              return parsePostSpace(group[1]);
            };

            if ((keyword = consumeToken(block_keyword_tok)).empty()) throw std::runtime_error("Expected block keyword");

            if (keyword == "if") {
              auto condition = parseExpression();
              if (!condition) throw std::runtime_error("Expected condition in if block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<IfTemplateToken>(location, pre_space, post_space, std::move(condition)));
            } else if (keyword == "elif") {
              auto condition = parseExpression();
              if (!condition) throw std::runtime_error("Expected condition in elif block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ElifTemplateToken>(location, pre_space, post_space, std::move(condition)));
            } else if (keyword == "else") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ElseTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "endif") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndIfTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "for") {
              static std::regex recursive_tok(R"(recursive\b)");
              static std::regex if_tok(R"(if\b)");

              auto varnames = parseVarNames();
              static std::regex in_tok(R"(in\b)");
              if (consumeToken(in_tok).empty()) throw std::runtime_error("Expected 'in' keyword in for block");
              auto iterable = parseExpression(/* allow_if_expr = */ false);
              if (!iterable) throw std::runtime_error("Expected iterable in for block");

              std::shared_ptr<Expression> condition;
              if (!consumeToken(if_tok).empty()) {
                condition = parseExpression();
              }
              auto recursive = !consumeToken(recursive_tok).empty();

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<ForTemplateToken>(location, pre_space, post_space, std::move(varnames), std::move(iterable), std::move(condition), recursive));
            } else if (keyword == "endfor") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndForTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "generation") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<GenerationTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "endgeneration") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndGenerationTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "set") {
              static std::regex namespaced_var_regex(R"((\w+)\s*\.\s*(\w+))");

              std::string ns;
              std::vector<std::string> var_names;
              std::shared_ptr<Expression> value;
              if (!(group = consumeTokenGroups(namespaced_var_regex)).empty()) {
                ns = group[1];
                var_names.push_back(group[2]);

                if (consumeToken("=").empty()) throw std::runtime_error("Expected equals sign in set block");

                value = parseExpression();
                if (!value) throw std::runtime_error("Expected value in set block");
              } else {
                var_names = parseVarNames();

                if (!consumeToken("=").empty()) {
                  value = parseExpression();
                  if (!value) throw std::runtime_error("Expected value in set block");
                }
              }
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<SetTemplateToken>(location, pre_space, post_space, ns, var_names, std::move(value)));
            } else if (keyword == "endset") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndSetTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "macro") {
              auto macroname = parseIdentifier();
              if (!macroname) throw std::runtime_error("Expected macro name in macro block");
              auto params = parseParameters();

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<MacroTemplateToken>(location, pre_space, post_space, std::move(macroname), std::move(params)));
            } else if (keyword == "endmacro") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndMacroTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "filter") {
              auto filter = parseExpression();
              if (!filter) throw std::runtime_error("Expected expression in filter block");

              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<FilterTemplateToken>(location, pre_space, post_space, std::move(filter)));
            } else if (keyword == "endfilter") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<EndFilterTemplateToken>(location, pre_space, post_space));
            } else if (keyword == "break" || keyword == "continue") {
              auto post_space = parseBlockClose();
              tokens.push_back(std::make_unique<LoopControlTemplateToken>(location, pre_space, post_space, keyword == "break" ? LoopControlType::Break : LoopControlType::Continue));
            } else {
              throw std::runtime_error("Unexpected block: " + keyword);
            }
          } else if (std::regex_search(it, end, match, non_text_open_regex)) {
            if (!match.position()) {
                if (match[0] != "{#")
                    throw std::runtime_error("Internal error: Expected a comment");
                throw std::runtime_error("Missing end of comment tag");
            }
            auto text_end = it + match.position();
            text = std::string(it, text_end);
            it = text_end;
            tokens.push_back(std::make_unique<TextTemplateToken>(location, SpaceHandling::Keep, SpaceHandling::Keep, text));
          } else {
            text = std::string(it, end);
            it = end;
            tokens.push_back(std::make_unique<TextTemplateToken>(location, SpaceHandling::Keep, SpaceHandling::Keep, text));
          }
        }
        return tokens;
      } catch (const std::exception & e) {
        throw std::runtime_error(e.what() + error_location_suffix(*template_str, std::distance(start, it)));
      }
    }